

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O2

UINT8 device_start_saa1099_vb(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA info;
  long lVar2;
  UINT8 UVar3;
  uint *puVar4;
  uint uVar5;
  
  uVar1 = cfg->clock;
  uVar5 = uVar1 >> 7;
  if (cfg->srMode == '\x02') {
    if (uVar5 <= cfg->smplRate) {
      uVar5 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar5 = cfg->smplRate;
  }
  info.chipInf = calloc(1,0x110);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    *(uint *)((long)info.chipInf + 0x10c) = uVar1;
    *(uint *)&((DEV_DATA *)((long)info.chipInf + 0x108))->chipInf = uVar5;
    ((DEV_DATA *)((long)info.chipInf + 0xf8))->chipInf =
         (void *)(CONCAT44(uVar1,(uVar5 << 7) >> 1) / (ulong)(uVar5 << 7));
    puVar4 = (uint *)((long)info.chipInf + 0xb4);
    for (lVar2 = 0; lVar2 != 0x8000; lVar2 = lVar2 + 0x800) {
      *puVar4 = (ushort)lVar2 / 6;
      puVar4 = puVar4 + 1;
    }
    UVar3 = '\0';
    saa1099v_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = uVar5;
    retDevInf->devDef = &devDef_SAA1099_VB;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_saa1099_vb(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 128;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = saa1099v_create(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SAA1099_VB);
	return 0x00;
}